

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O0

bool __thiscall
ViconCGStreamClientSDK::VCGClient::WaitFrames
          (VCGClient *this,
          vector<ViconCGStreamClientSDK::ICGFrameState,_std::allocator<ViconCGStreamClientSDK::ICGFrameState>_>
          *o_rFrames,uint i_TimeoutMs)

{
  bool bVar1;
  int iVar2;
  xtime_nsec_t AdditionalNanoSeconds;
  xtime_sec_t AdditionalSeconds;
  undefined1 local_48 [8];
  xtime WaitDeadline;
  scoped_lock Lock;
  uint i_TimeoutMs_local;
  vector<ViconCGStreamClientSDK::ICGFrameState,_std::allocator<ViconCGStreamClientSDK::ICGFrameState>_>
  *o_rFrames_local;
  VCGClient *this_local;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)&WaitDeadline.nsec,&this->m_ClientMutex);
  boost::xtime_get((xtime *)local_48,1);
  local_48 = (undefined1  [8])((long)((double)i_TimeoutMs / 1000.0) + (long)local_48);
  WaitDeadline.sec =
       ((ulong)i_TimeoutMs + (long)((double)i_TimeoutMs / 1000.0) * -1000) * 1000000 +
       WaitDeadline.sec;
  do {
    bVar1 = std::
            deque<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
            ::empty(&this->m_FrameDeque);
    if (!bVar1) {
      iVar2 = (*(this->super_ICGClient)._vptr_ICGClient[0x15])(this,o_rFrames);
      this_local._7_1_ = (bool)((byte)iVar2 & 1);
      goto LAB_001d5ae6;
    }
    bVar1 = boost::condition_variable_any::timed_wait<boost::unique_lock<boost::recursive_mutex>>
                      (&this->m_NewFramesCondition,
                       (unique_lock<boost::recursive_mutex> *)&WaitDeadline.nsec,(xtime *)local_48);
  } while (bVar1);
  this_local._7_1_ = false;
LAB_001d5ae6:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)&WaitDeadline.nsec);
  return this_local._7_1_;
}

Assistant:

bool VCGClient::WaitFrames( std::vector< ICGFrameState > & o_rFrames, unsigned int i_TimeoutMs )
{
  boost::recursive_mutex::scoped_lock Lock( m_ClientMutex );

  boost::xtime WaitDeadline;

  // boost::TIME_UTC has been renamed to boost::TIME_UTC_ in Boost 1.50:
  // https://svn.boost.org/trac/boost/ticket/6940
#if BOOST_VERSION >= 105000
  boost::xtime_get( &WaitDeadline, boost::TIME_UTC_ );
#else
  boost::xtime_get( &WaitDeadline, boost::TIME_UTC );
#endif
  boost::xtime::xtime_sec_t  AdditionalSeconds     = static_cast< boost::xtime::xtime_sec_t  >( static_cast< double >( i_TimeoutMs ) / 1000.0 );
  boost::xtime::xtime_nsec_t AdditionalNanoSeconds = static_cast< boost::xtime::xtime_nsec_t >( ( i_TimeoutMs - ( 1000 * AdditionalSeconds ) ) * 1000000 );
 
  WaitDeadline.sec += AdditionalSeconds;
  WaitDeadline.nsec += AdditionalNanoSeconds;

  while( m_FrameDeque.empty() )
  {
    if( !m_NewFramesCondition.timed_wait( Lock, WaitDeadline ) )
    {
      return false;
    }
  }
  
  return PollFrames( o_rFrames );
}